

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_xyz_grad(REF_DBL **xyzs,REF_DBL *scalar,REF_DBL *gradient)

{
  REF_DBL *xyz1;
  REF_DBL *xyz0;
  REF_DBL *xyz2;
  REF_DBL *xyz1_00;
  undefined1 auVar1 [16];
  REF_STATUS RVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  REF_DBL RVar10;
  double dVar11;
  REF_DBL norm2 [3];
  REF_DBL norm1 [3];
  double local_50;
  REF_DBL norm3 [3];
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  ref_node_xyz_vol(xyzs,&local_50);
  dVar3 = local_50 * -6.0;
  xyz1 = xyzs[3];
  xyz0 = *xyzs;
  xyz2 = xyzs[2];
  ref_node_xyz_normal(xyz0,xyz1,xyz2,norm1);
  xyz1_00 = xyzs[1];
  ref_node_xyz_normal(xyz0,xyz1_00,xyz1,norm2);
  ref_node_xyz_normal(xyz0,xyz2,xyz1_00,norm3);
  dVar5 = *scalar;
  auVar4._0_8_ = (scalar[3] - dVar5) * norm3[0] +
                 (scalar[1] - dVar5) * norm1[0] + (scalar[2] - dVar5) * norm2[0];
  *gradient = auVar4._0_8_;
  dVar5 = *scalar;
  dVar5 = (scalar[3] - dVar5) * norm3[1] +
          (scalar[2] - dVar5) * norm2[1] + (scalar[1] - dVar5) * norm1[1];
  gradient[1] = dVar5;
  auVar7._0_8_ = dVar3 * 1e+20;
  auVar7._8_8_ = auVar4._0_8_;
  auVar8._8_8_ = -auVar4._0_8_;
  auVar8._0_8_ = -auVar7._0_8_;
  auVar8 = maxpd(auVar7,auVar8);
  dVar6 = auVar8._0_8_;
  if (auVar8._8_8_ < dVar6) {
    dVar11 = dVar5;
    if (dVar5 <= -dVar5) {
      dVar11 = -dVar5;
    }
    if (dVar11 < dVar6) {
      dVar11 = *scalar;
      dVar9 = (scalar[3] - dVar11) * norm3[2] +
              (scalar[1] - dVar11) * norm1[2] + (scalar[2] - dVar11) * norm2[2];
      dVar11 = dVar9;
      if (dVar9 <= -dVar9) {
        dVar11 = -dVar9;
      }
      if (dVar11 < dVar6) {
        auVar4._8_8_ = dVar5;
        RVar10 = dVar9 / dVar3;
        auVar1._8_8_ = dVar3;
        auVar1._0_8_ = dVar3;
        auVar8 = divpd(auVar4,auVar1);
        *(undefined1 (*) [16])gradient = auVar8;
        RVar2 = 0;
        goto LAB_0014a451;
      }
    }
  }
  *gradient = 0.0;
  gradient[1] = 0.0;
  RVar2 = 4;
  RVar10 = 0.0;
LAB_0014a451:
  gradient[2] = RVar10;
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_xyz_grad(REF_DBL *xyzs[4], REF_DBL *scalar,
                                     REF_DBL *gradient) {
  REF_DBL vol, norm1[3], norm2[3], norm3[3];
  REF_DBL *xyz0, *xyz1, *xyz2;

  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_xyz_vol(xyzs, &vol), "vol");
  vol *= -6.0;

  xyz0 = xyzs[0];
  xyz1 = xyzs[3];
  xyz2 = xyzs[2];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm1), "vol");

  xyz0 = xyzs[0];
  xyz1 = xyzs[1];
  xyz2 = xyzs[3];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm2), "vol");

  xyz0 = xyzs[0];
  xyz1 = xyzs[2];
  xyz2 = xyzs[1];
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, norm3), "vol");

  gradient[0] = (scalar[1] - scalar[0]) * norm1[0] +
                (scalar[2] - scalar[0]) * norm2[0] +
                (scalar[3] - scalar[0]) * norm3[0];
  gradient[1] = (scalar[1] - scalar[0]) * norm1[1] +
                (scalar[2] - scalar[0]) * norm2[1] +
                (scalar[3] - scalar[0]) * norm3[1];
  gradient[2] = (scalar[1] - scalar[0]) * norm1[2] +
                (scalar[2] - scalar[0]) * norm2[2] +
                (scalar[3] - scalar[0]) * norm3[2];

  if (ref_math_divisible(gradient[0], vol) &&
      ref_math_divisible(gradient[1], vol) &&
      ref_math_divisible(gradient[2], vol)) {
    gradient[0] /= vol;
    gradient[1] /= vol;
    gradient[2] /= vol;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}